

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O0

bool __thiscall
glcts::ShaderBitfieldOperationCaseBitfieldExtractInt::test
          (ShaderBitfieldOperationCaseBitfieldExtractInt *this,Data *data)

{
  int local_24;
  GLint expected;
  int i;
  Data *data_local;
  ShaderBitfieldOperationCaseBitfieldExtractInt *this_local;
  
  local_24 = 0;
  while( true ) {
    if (this->m_components <= local_24) {
      return true;
    }
    if (data->outIvec4[local_24] !=
        (data->inIvec4[local_24] << (0x20U - ((char)data->offset + (char)data->bits) & 0x1f)) >>
        (0x20U - (char)data->bits & 0x1f)) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLint expected = data->inIvec4[i] << (32 - (data->offset + data->bits));
			expected >>= 32 - data->bits;
			if (data->outIvec4[i] != expected)
			{
				return false;
			}
		}
		return true;
	}